

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoScripts.cpp
# Opt level: O2

float SoftMaxLoss(vector<float,_std::allocator<float>_> *output,Target classId,
                 vector<float,_std::allocator<float>_> *softMax,
                 vector<float,_std::allocator<float>_> *deltas,float *S)

{
  float *pfVar1;
  pointer pfVar2;
  int neuronId;
  float *pfVar3;
  ulong uVar4;
  vector<float,_std::allocator<float>_> *__range1;
  float fVar5;
  float local_68;
  float local_60;
  float local_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  pfVar3 = (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar1 = (output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_68 = 0.0;
  for (; pfVar3 != pfVar1; pfVar3 = pfVar3 + 1) {
    local_5c = expf(*pfVar3);
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(softMax,&local_5c);
    local_68 = local_68 +
               (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish[-1];
  }
  local_58 = 0.0;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(output->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
    fVar5 = (float)(-(uint)(ABS(classId - (float)(int)uVar4) < 1e-05) & 0x3f800000);
    local_48 = ZEXT416((uint)fVar5);
    pfVar2 = (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_60 = pfVar2[uVar4] / local_68;
    pfVar2[uVar4] = local_60;
    local_60 = local_60 - fVar5;
    std::vector<float,_std::allocator<float>_>::emplace_back<float>(deltas,&local_60);
    pfVar2 = (softMax->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *S = pfVar2[uVar4] *
         (deltas->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
         ._M_start[uVar4] + *S;
    fVar5 = logf(pfVar2[uVar4]);
    local_58 = local_58 + fVar5 * (float)local_48._0_4_;
  }
  return -local_58;
}

Assistant:

float SoftMaxLoss( const std::vector<float> &output, SPIKING_NN::Target classId,
                   std::vector<float> &softMax, std::vector<float> &deltas, float *S )
{
    float expSum = 0;
    float loss = 0;
    for ( auto activation: output ) {
        // TODO: make some exps on final target (important to understand everything around gradients formulas)
        softMax.emplace_back( exp( activation ));
        expSum += softMax.back();
    }
    for ( int neuronId = 0; neuronId < output.size(); neuronId++ ) {
        auto target = static_cast<float>( abs( classId - neuronId ) < SPIKING_NN::EPS );
        softMax[neuronId] /= expSum;
        deltas.emplace_back( softMax[neuronId] - target );
        *S += softMax[neuronId] * deltas[neuronId];
        loss += target * log( softMax[neuronId] );
    }
    return -loss;
}